

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcole.c
# Opt level: O0

int ffr4fi1(float *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  uchar *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  float *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      dVar1 = ((double)input[ii] - zero) / scale;
      if (-0.49 <= dVar1) {
        if (dVar1 <= 255.49) {
          output[ii] = (uchar)(int)(dVar1 + 0.5);
        }
        else {
          *status = -0xb;
          output[ii] = 0xff;
        }
      }
      else {
        *status = -0xb;
        output[ii] = '\0';
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      if (-0.49 <= input[ii]) {
        if (input[ii] <= 255.49) {
          output[ii] = (uchar)(int)input[ii];
        }
        else {
          *status = -0xb;
          output[ii] = 0xff;
        }
      }
      else {
        *status = -0xb;
        output[ii] = '\0';
      }
    }
  }
  return *status;
}

Assistant:

int ffr4fi1(float *input,          /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (input[ii] > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}